

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus
debugHighsSolution(string *message,HighsOptions *options,HighsModel *model,HighsSolution *solution,
                  HighsBasis *basis,HighsModelStatus model_status,HighsInfo *info)

{
  HighsDebugStatus HVar1;
  HighsInfo *in_RDI;
  bool check_model_status_and_highs_info;
  HighsInfo highs_info;
  bool in_stack_0000015f;
  HighsBasis *in_stack_00000160;
  HighsSolution *in_stack_00000168;
  HighsHessian *in_stack_00000170;
  HighsLp *in_stack_00000178;
  HighsOptions *in_stack_00000180;
  string *in_stack_00000188;
  HighsModelStatus in_stack_000001a0;
  HighsInfo *in_stack_000001a8;
  HighsInfo *this;
  HighsInfo *in_stack_fffffffffffffee0;
  string local_110 [39];
  undefined1 local_e9;
  HighsInfo local_e8;
  
  HighsInfo::HighsInfo(in_stack_fffffffffffffee0,in_RDI);
  local_e9 = 1;
  std::__cxx11::string::string(local_110,(string *)in_RDI);
  this = &local_e8;
  HVar1 = debugHighsSolution(in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170
                             ,in_stack_00000168,in_stack_00000160,in_stack_000001a0,
                             in_stack_000001a8,in_stack_0000015f);
  std::__cxx11::string::~string(local_110);
  HighsInfo::~HighsInfo(this);
  return HVar1;
}

Assistant:

HighsDebugStatus debugHighsSolution(
    const string message, const HighsOptions& options, const HighsModel& model,
    const HighsSolution& solution, const HighsBasis& basis,
    const HighsModelStatus model_status, const HighsInfo& info) {
  // Non-trivially expensive analysis of a solution to a model
  //
  // Called to check the HiGHS model_status and info
  //
  // Copy the data from info to highs_info so general method can be used
  //
  HighsInfo highs_info = info;
  const bool check_model_status_and_highs_info = true;
  return debugHighsSolution(message, options, model.lp_, model.hessian_,
                            solution, basis, model_status, highs_info,
                            check_model_status_and_highs_info);
}